

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCreate.c
# Opt level: O1

Map_Node_t * Map_NodeAnd(Map_Man_t *pMan,Map_Node_t *p1,Map_Node_t *p2)

{
  int iVar1;
  uint uVar2;
  Map_Node_t **ppMVar3;
  uint uVar4;
  Map_Node_t *pMVar5;
  Map_Node_t **ppMVar6;
  ulong uVar7;
  Map_Node_t *pMVar8;
  Map_Node_t *pMVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  Map_Node_t *pMVar16;
  timespec ts;
  timespec local_40;
  
  if (p1 != p2) {
    if ((Map_Node_t *)((ulong)p2 ^ 1) == p1) {
      p1 = (Map_Node_t *)((ulong)pMan->pConst1 ^ 1);
    }
    else {
      iVar10 = *(int *)(((ulong)p1 & 0xfffffffffffffffe) + 0x10);
      if (iVar10 == -1) {
        pMVar9 = pMan->pConst1;
        if (pMVar9 == p1) {
          return p2;
        }
      }
      else {
        iVar1 = *(int *)(((ulong)p2 & 0xfffffffffffffffe) + 0x10);
        if (iVar1 != -1) {
          pMVar9 = p2;
          if (iVar1 < iVar10) {
            pMVar9 = p1;
            p1 = p2;
          }
          iVar10 = pMan->nBins;
          uVar14 = (long)pMVar9 * 0xc00005 + (long)p1;
          uVar11 = uVar14 % (ulong)(long)iVar10;
          for (pMVar5 = pMan->pBins[uVar11 & 0xffffffff]; pMVar5 != (Map_Node_t *)0x0;
              pMVar5 = pMVar5->pNext) {
            if ((pMVar5->p1 == p1) && (pMVar5->p2 == pMVar9)) {
              return pMVar5;
            }
          }
          if (SBORROW4(pMan->nNodes,iVar10 * 2) == pMan->nNodes + iVar10 * -2 < 0) {
            clock_gettime(3,&local_40);
            uVar2 = pMan->nBins;
            uVar12 = uVar2 * 2 - 1;
            while( true ) {
              do {
                uVar13 = uVar12 + 1;
                uVar4 = uVar12 & 1;
                uVar12 = uVar13;
              } while (uVar4 != 0);
              if (uVar13 < 9) break;
              iVar10 = 5;
              while (uVar13 % (iVar10 - 2U) != 0) {
                uVar4 = iVar10 * iVar10;
                iVar10 = iVar10 + 2;
                if (uVar13 < uVar4) goto LAB_003fc92e;
              }
            }
LAB_003fc92e:
            uVar11 = (ulong)(int)uVar13;
            ppMVar6 = (Map_Node_t **)malloc(uVar11 * 8);
            iVar10 = 0;
            memset(ppMVar6,0,uVar11 * 8);
            if (0 < (int)uVar2) {
              ppMVar3 = pMan->pBins;
              uVar15 = 0;
              iVar10 = 0;
              do {
                pMVar5 = ppMVar3[uVar15];
                if (pMVar5 != (Map_Node_t *)0x0) {
                  pMVar8 = pMVar5->pNext;
                  do {
                    pMVar16 = pMVar8;
                    uVar7 = (ulong)((long)pMVar5->p2 * 0xc00005 + (long)pMVar5->p1) % uVar11 &
                            0xffffffff;
                    pMVar5->pNext = ppMVar6[uVar7];
                    ppMVar6[uVar7] = pMVar5;
                    pMVar8 = (Map_Node_t *)0x0;
                    if (pMVar16 != (Map_Node_t *)0x0) {
                      pMVar8 = pMVar16->pNext;
                    }
                    iVar10 = iVar10 + 1;
                    pMVar5 = pMVar16;
                  } while (pMVar16 != (Map_Node_t *)0x0);
                }
                uVar15 = uVar15 + 1;
              } while (uVar15 != uVar2);
            }
            if (iVar10 != pMan->nNodes - pMan->nInputs) {
              __assert_fail("Counter == pMan->nNodes - pMan->nInputs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCreate.c"
                            ,0x211,"void Map_TableResize(Map_Man_t *)");
            }
            if (pMan->pBins != (Map_Node_t **)0x0) {
              free(pMan->pBins);
              pMan->pBins = (Map_Node_t **)0x0;
            }
            pMan->pBins = ppMVar6;
            pMan->nBins = uVar13;
            uVar11 = uVar14 % uVar11;
          }
          pMVar9 = Map_NodeCreate(pMan,p1,pMVar9);
          ppMVar6 = pMan->pBins;
          pMVar9->pNext = ppMVar6[uVar11 & 0xffffffff];
          ppMVar6[uVar11 & 0xffffffff] = pMVar9;
          return pMVar9;
        }
        pMVar9 = pMan->pConst1;
        if (pMVar9 == p2) {
          return p1;
        }
      }
      p1 = (Map_Node_t *)((ulong)pMVar9 ^ 1);
    }
  }
  return p1;
}

Assistant:

Map_Node_t * Map_NodeAnd( Map_Man_t * pMan, Map_Node_t * p1, Map_Node_t * p2 )
{
    Map_Node_t * pEnt;
    unsigned Key;

    if ( p1 == p2 )
        return p1;
    if ( p1 == Map_Not(p2) )
        return Map_Not(pMan->pConst1);
    if ( Map_NodeIsConst(p1) )
    {
        if ( p1 == pMan->pConst1 )
            return p2;
        return Map_Not(pMan->pConst1);
    }
    if ( Map_NodeIsConst(p2) )
    {
        if ( p2 == pMan->pConst1 )
            return p1;
        return Map_Not(pMan->pConst1);
    }

    if ( Map_Regular(p1)->Num > Map_Regular(p2)->Num )
        pEnt = p1, p1 = p2, p2 = pEnt;

    Key = Map_HashKey2( p1, p2, pMan->nBins );
    for ( pEnt = pMan->pBins[Key]; pEnt; pEnt = pEnt->pNext )
        if ( pEnt->p1 == p1 && pEnt->p2 == p2 )
            return pEnt;
    // resize the table
    if ( pMan->nNodes >= 2 * pMan->nBins )
    {
        Map_TableResize( pMan );
        Key = Map_HashKey2( p1, p2, pMan->nBins );
    }
    // create the new node
    pEnt = Map_NodeCreate( pMan, p1, p2 );
    // add the node to the corresponding linked list in the table
    pEnt->pNext = pMan->pBins[Key];
    pMan->pBins[Key] = pEnt;
    return pEnt;
}